

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keygen.c
# Opt level: O0

int ulp_generate_parameters(size_t n,size_t l,uint64_t *sk,uint64_t *se,uint64_t *q)

{
  long lVar1;
  int iVar2;
  uint64_t uVar3;
  ulong *in_RCX;
  ulong *in_RDX;
  uint64_t in_RSI;
  ulong in_RDI;
  ulong *in_R8;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int local_4;
  undefined4 uVar9;
  
  if ((((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == (ulong *)0x0)) ||
     ((in_RCX == (ulong *)0x0 || (in_R8 == (ulong *)0x0)))) {
    local_4 = -2;
  }
  else if ((in_RDI & 7) == 0) {
    uVar9 = (undefined4)(in_RDI >> 0x20);
    auVar7._8_4_ = uVar9;
    auVar7._0_8_ = in_RDI;
    auVar7._12_4_ = 0x45300000;
    dVar6 = pow(((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_RDI) - 4503599627370496.0)) * 35.184077269267,
                1.2857142857142858);
    dVar6 = ceil(dVar6);
    *in_RDX = (long)dVar6 | (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f;
    lVar1 = in_RSI + in_RDI * 2;
    auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar8._0_8_ = lVar1;
    auVar8._12_4_ = 0x45300000;
    auVar10._8_4_ = (int)(in_RSI >> 0x20);
    auVar10._0_8_ = in_RSI;
    auVar10._12_4_ = 0x45300000;
    auVar11._8_4_ = uVar9;
    auVar11._0_8_ = in_RDI;
    auVar11._12_4_ = 0x45300000;
    dVar6 = pow(((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 17.5920386346335,
                (((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)) *
                1.1428571428571428) /
                ((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_RDI) - 4503599627370496.0)) +
                1.2857142857142858);
    dVar6 = ceil(dVar6);
    *in_RCX = (long)dVar6 | (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f;
    powl();
    lVar4 = (longdouble)9.223372e+18;
    lVar5 = (longdouble)0;
    if (lVar4 <= in_ST0) {
      lVar5 = lVar4;
    }
    uVar3 = max((long)ROUND(in_ST0 - lVar5) ^ (ulong)(lVar4 <= in_ST0) << 0x3f,
                in_RDI * 8 * *in_RCX * *in_RDX + *in_RCX * 4 + 4);
    *in_R8 = uVar3;
    if ((*in_R8 & 1) == 0) {
      *in_R8 = *in_R8 + 1;
    }
    while (iVar2 = is_prime(in_RSI), iVar2 == 0) {
      *in_R8 = *in_R8 + 2;
    }
    if (*in_R8 < 0x8000000000000000) {
      local_4 = 0;
    }
    else {
      local_4 = -0x3f;
    }
  }
  else {
    local_4 = -8;
  }
  return local_4;
}

Assistant:

int ulp_generate_parameters(size_t n, size_t l, uint64_t* sk, uint64_t* se, uint64_t* q) {

    if(n == 0 || l == 0 || sk == NULL || se == NULL || q == NULL)
        return -2;

    if(n % 8 != 0)
        return -8;

    // compute parameters
    *sk = ceil(pow(2*C*n, 9.0/7.0));
    *se = ceil(pow(C*(2*n+l), 9.0/7.0 + 8.0/7.0 * (double)l/(double)n));
    *q = max(powl(4*(*se), 2), 8*n*(*se)*(*sk) + 4*(*se) + 4);
    // search next prime number
    if(*q % 2 == 0)
        (*q)++;
    while(!is_prime(*q))
        (*q)+=2;

    if(*q >= 0x8000000000000000) // 2^63
        return -63;

    return 0;

}